

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

bool __thiscall
lambertian::scatter(lambertian *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  double dVar1;
  element_type *peVar2;
  bool bVar3;
  undefined1 local_88 [16];
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  double local_40;
  
  random_unit_vector();
  local_78 = (rec->normal).e[2] + local_58;
  dStack_60 = (rec->normal).e[1] + dStack_60;
  local_88._8_4_ = SUB84(dStack_60,0);
  local_88._0_8_ = (rec->normal).e[0] + local_68;
  local_88._12_4_ = (int)((ulong)dStack_60 >> 0x20);
  bVar3 = vec3::near_zero((vec3 *)local_88);
  if (bVar3) {
    local_78 = (rec->normal).e[2];
    local_88 = *(undefined1 (*) [16])(rec->normal).e;
  }
  dVar1 = r_in->tm;
  local_58 = (rec->p).e[2];
  local_68 = (rec->p).e[0];
  dStack_60 = (rec->p).e[1];
  local_40 = local_78;
  local_50 = local_88._0_4_;
  uStack_4c = local_88._4_4_;
  uStack_48 = local_88._8_4_;
  uStack_44 = local_88._12_4_;
  (scattered->orig).e[0] = local_68;
  (scattered->orig).e[1] = dStack_60;
  (scattered->dir).e[1] = local_88._8_8_;
  (scattered->dir).e[2] = local_78;
  (scattered->orig).e[2] = local_58;
  (scattered->dir).e[0] = local_88._0_8_;
  scattered->tm = dVar1;
  peVar2 = (this->tex).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_texture[2])(SUB84(rec->u,0),SUB84(rec->v,0),&local_68,peVar2,rec);
  attenuation->e[2] = local_58;
  attenuation->e[0] = local_68;
  attenuation->e[1] = dStack_60;
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        auto scatter_direction = rec.normal + random_unit_vector();

        // Catch degenerate scatter direction
        if (scatter_direction.near_zero())
            scatter_direction = rec.normal;

        scattered = ray(rec.p, scatter_direction, r_in.time());
        attenuation = tex->value(rec.u, rec.v, rec.p);
        return true;
    }